

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O2

ssize_t __thiscall
ApprovalTests::StringWriter::write(StringWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream out;
  byte abStack_200 [480];
  
  ::std::ofstream::ofstream
            (&out,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_register_00000034,__fd))->_M_dataplus)._M_p,_S_out);
  if ((abStack_200[*(long *)(_out + -0x18)] & 5) == 0) {
    Write(this,(ostream *)&out);
    ::std::ofstream::close();
    sVar1 = ::std::ofstream::~ofstream(&out);
    return sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_240,"Unable to write file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_register_00000034,__fd));
  ::std::runtime_error::runtime_error(this_00,(string *)&local_240);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StringWriter::write(std::string path) const
    {
        std::ofstream out(path.c_str(), std::ofstream::out);
        if (!out)
        {
            throw std::runtime_error("Unable to write file: " + path);
        }
        this->Write(out);
        out.close();
    }